

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O1

string * __thiscall
higan::Codec::DecodeUrl_abi_cxx11_(string *__return_storage_ptr__,Codec *this,char *url,size_t len)

{
  Codec *begin;
  int iVar1;
  Codec *__s;
  Codec *__dest;
  Codec *pCVar2;
  
  __s = (Codec *)operator_new__((ulong)(url + 1));
  memset(__s,0,(size_t)(url + 1));
  __dest = __s;
  if (0 < (long)url) {
    pCVar2 = (Codec *)(url + (long)this);
    do {
      begin = this + 1;
      if (*this == (Codec)0x25) {
        if ((long)pCVar2 - (long)begin < 2) {
          if (pCVar2 != begin) {
            memmove(__dest,begin,(long)pCVar2 - (long)begin);
          }
          break;
        }
        iVar1 = HexCharArrayToInt((char *)begin,(char *)(this + 3));
        if (iVar1 == -1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          return __return_storage_ptr__;
        }
        *__dest = SUB41(iVar1,0);
        this = this + 3;
      }
      else {
        *__dest = *this;
        this = begin;
      }
      __dest = __dest + 1;
    } while (this < pCVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__dest);
  return __return_storage_ptr__;
}

Assistant:

std::string Codec::DecodeUrl(const char* url, size_t len)
{
	char* buffer = new char[len + 1]{};

	const char* url_ptr = url;
	const char* url_end = url + len;

	char* buffer_ptr = buffer;

	while (url_ptr < url_end)
	{
		if (*url_ptr == '%')
		{
			url_ptr++;
			/**
			 * % 后面需要有两位字符 不足两位说明存在问题 拷贝剩余字符后break
			 */
			if (url_end - url_ptr >= 2)
			{
				int num = HexCharArrayToInt(url_ptr, url_ptr + 2);
				if (num == -1)
				{
					return "";
				}
				*buffer_ptr++ = static_cast<char>(num);
				url_ptr += 2;
			}
			else
			{
				std::copy(url_ptr, url_end, buffer_ptr);
				break;
			}
		}
		else
		{
			*buffer_ptr++ = *url_ptr++;
		}
	}

	return std::string(buffer, buffer_ptr);
}